

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

bool DivisionCornerCaseHelper<long,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long_long lhs,
               SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  ulong uVar1;
  
  if (rhs.m_int < 1) {
    if (rhs.m_int == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    if ((long)(lhs / (ulong)-rhs.m_int) < 0) goto LAB_00120680;
    uVar1 = -(lhs / (ulong)-rhs.m_int);
  }
  else {
    uVar1 = lhs / (ulong)rhs.m_int;
    if ((long)uVar1 < 0) {
LAB_00120680:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  result->m_int = uVar1;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }